

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void jobqueue_clear(jobqueue *jobqueue_p)

{
  job *__ptr;
  jobqueue *jobqueue_p_local;
  
  while (jobqueue_p->len != 0) {
    __ptr = jobqueue_pull(jobqueue_p);
    free(__ptr);
  }
  jobqueue_p->front = (job *)0x0;
  jobqueue_p->rear = (job *)0x0;
  bsem_reset(jobqueue_p->has_jobs);
  jobqueue_p->len = 0;
  return;
}

Assistant:

static void jobqueue_clear(jobqueue *jobqueue_p) {
    while (jobqueue_p->len) {
        free(jobqueue_pull(jobqueue_p));
    }

    jobqueue_p->front = NULL;
    jobqueue_p->rear = NULL;
    bsem_reset(jobqueue_p->has_jobs);
    jobqueue_p->len = 0;
}